

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O0

int __thiscall E64::blitter_ic::terminal_putchar(blitter_ic *this,uint8_t number,int character)

{
  ushort uVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  uint8_t result;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  if (in_DL == 9) {
    while( true ) {
      uVar5 = (uint)*(ushort *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140 + 0x34);
      bVar2 = blit_t::get_columns((blit_t *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140))
      ;
      if (((int)uVar5 % (int)(uint)bVar2 & 3U) == 0) break;
      terminal_putsymbol((blitter_ic *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                         ,(uint8_t)(uVar5 >> 0x18),(char)(uVar5 >> 0x10));
    }
  }
  else if (in_DL == 10) {
    uVar5 = (uint)*(ushort *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140 + 0x34);
    bVar2 = blit_t::get_columns((blit_t *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140));
    lVar4 = *(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140;
    *(short *)(lVar4 + 0x34) = *(short *)(lVar4 + 0x34) - (short)((int)uVar5 % (int)(uint)bVar2);
    uVar5 = (uint)*(ushort *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140 + 0x34);
    bVar2 = blit_t::get_columns((blit_t *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140));
    bVar3 = blit_t::get_rows((blit_t *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140));
    if ((int)uVar5 / (int)(uint)bVar2 == bVar3 - 1) {
      terminal_add_bottom_row(this,number);
    }
    else {
      bVar2 = blit_t::get_columns((blit_t *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140))
      ;
      lVar4 = *(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140;
      *(ushort *)(lVar4 + 0x34) = *(short *)(lVar4 + 0x34) + (ushort)bVar2;
    }
  }
  else if (in_DL == 0xd) {
    uVar1 = *(ushort *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140 + 0x34);
    bVar2 = blit_t::get_columns((blit_t *)(*(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140));
    lVar4 = *(long *)(in_RDI + 0x14400a8) + (ulong)in_SIL * 0x140;
    *(ushort *)(lVar4 + 0x34) = *(short *)(lVar4 + 0x34) - uVar1 % (ushort)bVar2;
  }
  else {
    terminal_putsymbol((blitter_ic *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18),
                       (char)((uint)in_stack_ffffffffffffffcc >> 0x10));
  }
  return (int)in_DL;
}

Assistant:

int E64::blitter_ic::terminal_putchar(uint8_t number, int character)
{
	uint8_t result = (uint8_t)character;
	switch (result) {
		case '\r':
			blit[number].cursor_position -= blit[number].cursor_position % blit[number].get_columns();
			break;
		case '\n':
			blit[number].cursor_position -= blit[number].cursor_position % blit[number].get_columns();
			if ((blit[number].cursor_position / blit[number].get_columns()) == (blit[number].get_rows() - 1)) {
				terminal_add_bottom_row(number);
			} else {
				blit[number].cursor_position += blit[number].get_columns();
			}
			break;
		case '\t':
			while ((blit[number].cursor_position % blit[number].get_columns()) & 0b11) {
				terminal_putsymbol(number, ' ');
			}
			break;
		default:
			terminal_putsymbol(number, result);
			break;
	}
	return result;
}